

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

int32_t google::protobuf::internal::ReadVarintZigZag32(char **p)

{
  byte bVar1;
  byte *p_00;
  int i;
  long lVar2;
  pair<const_char_*,_unsigned_long> pVar3;
  
  p_00 = (byte *)*p;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  bVar1 = *p_00;
  if ((long)(char)bVar1 < 0) {
    pVar3 = VarintParseSlow64((char *)p_00,(uint)bVar1);
  }
  else {
    pVar3.second = (long)(char)bVar1;
    pVar3.first = (char *)(p_00 + 1);
  }
  *p = pVar3.first;
  return -((uint)pVar3.second & 1) ^ (uint)(pVar3.second >> 1) & 0x7fffffff;
}

Assistant:

inline int32_t ReadVarintZigZag32(const char** p) {
  uint64_t tmp;
  *p = VarintParse(*p, &tmp);
  return WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
}